

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

int bfgs_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
            double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double stol,
            double *xf)

{
  size_t __size;
  double dVar1;
  double eps2;
  double dVar2;
  int iVar3;
  int iVar4;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *L;
  double *f_00;
  ulong uVar5;
  char *__format;
  ulong uVar6;
  double fi;
  double dVar7;
  double dVar8;
  int local_34;
  
  __size = (long)N * 8;
  f = (double *)malloc(__size);
  array = (double *)malloc(__size);
  xi_00 = (double *)malloc(__size);
  x = (double *)malloc(__size);
  L = (double *)malloc((long)N * __size);
  f_00 = (double *)malloc(__size);
  *niter = 0;
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  uVar5 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    xi[uVar5] = dx[uVar5] * xi[uVar5];
    dx[uVar5] = 1.0 / dx[uVar5];
  }
  fi = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar7 = ABS(fi);
  local_34 = 0;
  if (1.79769313486232e+308 <= dVar7) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(fi)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar3 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar3 == 0xf) {
    local_34 = 0xf;
  }
  dVar8 = 0.0;
  if (maxstep <= 0.0) {
    dVar2 = 0.0;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = dx[uVar5];
      dVar2 = dVar2 + dVar1 * dVar1;
      dVar8 = dVar8 + dVar1 * xi[uVar5] * dVar1 * xi[uVar5];
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (dVar2 <= dVar8) {
      maxstep = dVar8 * 1000.0;
    }
    else {
      maxstep = dVar2 * 1000.0;
    }
  }
  if (dVar7 <= ABS(fsval)) {
    dVar7 = ABS(fsval);
  }
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar8 = ABS(xi[uVar5]);
    if (ABS(xi[uVar5]) <= 1.0 / ABS(dx[uVar5])) {
      dVar8 = 1.0 / ABS(dx[uVar5]);
    }
    array[uVar5] = (ABS(f[uVar5]) * dVar8) / dVar7;
  }
  dVar7 = array_max_abs(array,N);
  if (dVar7 <= gtol * 0.001) {
    local_34 = 1;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      xf[uVar5] = xi[uVar5];
    }
  }
  inithess_lower(L,N,fi,fsval,dx);
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    xi_00[uVar5] = xi[uVar5];
  }
  do {
    if (local_34 != 0) {
LAB_0012b60e:
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        xi[uVar5] = dx[uVar5] * xi[uVar5];
        dx[uVar5] = 1.0 / dx[uVar5];
      }
      free(f);
      free(array);
      free(xi_00);
      free(L);
      free(x);
      free(f_00);
      return local_34;
    }
    if (MAXITER <= *niter) {
      local_34 = 4;
      goto LAB_0012b60e;
    }
    *niter = *niter + 1;
    scale(f,1,N,-1.0);
    linsolve_lower(L,N,f,x);
    scale(f,1,N,-1.0);
    iVar3 = lnsrch(funcpt,xi_00,f,x,N,dx,maxstep,stol,xf);
    dVar7 = (*funcpt->funcpt)(xf,N,funcpt->params);
    if (1.79769313486232e+308 <= ABS(dVar7)) {
      __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012b5eb:
      printf(__format);
LAB_0012b5fe:
      local_34 = 0xf;
      goto LAB_0012b60e;
    }
    if (NAN(dVar7)) {
      __format = "Program Exiting as the function returns NaN";
      goto LAB_0012b5eb;
    }
    iVar4 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f_00);
    if (iVar4 == 0xf) goto LAB_0012b5fe;
    local_34 = stopcheck(dVar7,N,xi_00,xf,f_00,dx,fsval,gtol,stol,iVar3);
    bfgs_factored(L,N,eps,xi_00,xf,f,f_00);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      xi_00[uVar5] = xf[uVar5];
      f[uVar5] = f_00[uVar5];
    }
  } while( true );
}

Assistant:

int bfgs_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double stol,double *xf)  {
	int rcode,gfdcode;
	int i,siter,retval;
	double dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 15 -  Failure as Inf/Nan Values encountered 
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);

		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}